

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

double duckdb::CSVMultiFileInfo::GetProgressInFile(ClientContext *context,BaseFileReader *reader)

{
  element_type *peVar1;
  undefined8 uVar2;
  CSVBufferManager *pCVar3;
  pointer pCVar4;
  double dVar5;
  double extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  shared_ptr<duckdb::CSVBufferManager,_true> local_28;
  double local_18;
  double dStack_10;
  
  local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)reader[1]._vptr_BaseFileReader;
  local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reader[1].file.path._M_dataplus._M_p;
  if (local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  if (local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_18 = 100.0;
    dStack_10 = 0.0;
    goto LAB_00b9f5fb;
  }
  pCVar3 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&local_28);
  pCVar4 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&pCVar3->file_handle);
  if (pCVar4->compression_type == GZIP) {
LAB_00b9f580:
    pCVar3 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&local_28);
    pCVar4 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
             operator->(&pCVar3->file_handle);
    dVar5 = CSVFileHandle::GetProgress(pCVar4);
    dStack_10 = extraout_XMM0_Qb;
  }
  else {
    pCVar3 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&local_28);
    pCVar4 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
             operator->(&pCVar3->file_handle);
    if (pCVar4->compression_type == ZSTD) goto LAB_00b9f580;
    uVar2 = *(undefined8 *)((long)&reader[1].file.path.field_2 + 8);
    auVar6._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    dStack_10 = auVar6._8_8_ - 1.9342813113834067e+25;
    dVar5 = dStack_10 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  }
  peVar1 = reader[1].file.extended_info.internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18 = (dVar5 / (((double)CONCAT44(0x45300000,(int)((ulong)peVar1 >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)peVar1) - 4503599627370496.0))) * 100.0;
LAB_00b9f5fb:
  if (local_28.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return local_18;
}

Assistant:

double CSVMultiFileInfo::GetProgressInFile(ClientContext &context, const BaseFileReader &reader) {
	auto &csv_scan = reader.Cast<CSVFileScan>();

	auto buffer_manager = csv_scan.buffer_manager;
	if (!buffer_manager) {
		// We are done with this file, so it's 100%
		return 100.0;
	}
	double bytes_read;
	if (buffer_manager->file_handle->compression_type == FileCompressionType::GZIP ||
	    buffer_manager->file_handle->compression_type == FileCompressionType::ZSTD) {
		// compressed file: we care about the progress made in the *underlying* file handle
		// the bytes read from the uncompressed file are skewed
		bytes_read = buffer_manager->file_handle->GetProgress();
	} else {
		bytes_read = static_cast<double>(csv_scan.bytes_read);
	}
	double file_progress = bytes_read / static_cast<double>(csv_scan.file_size);
	return file_progress * 100.0;
}